

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lira_literal.h
# Opt level: O1

bool __thiscall
viras::
LiraLiteral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>
::lim(LiraLiteral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>
      *this,Infty i)

{
  RationalConstantType *o;
  PredSymbol PVar1;
  Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>
  *pCVar2;
  bool bVar3;
  Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>
  local_70;
  Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>
  local_48;
  
  PVar1 = this->symbol;
  if (PVar1 < Neq) {
    pCVar2 = (this->term).oslp.
             super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Kernel::RationalConstantType>
             .config;
    o = &(this->term).oslp.
         super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Kernel::RationalConstantType>
         .inner;
    if ((i.positive & 1U) == 0) {
      local_70.
      super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Kernel::RationalConstantType>
      .config = pCVar2;
      Kernel::IntegerConstantType::IntegerConstantType
                (&local_70.
                  super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Kernel::RationalConstantType>
                  .inner._num,&o->_num);
      Kernel::IntegerConstantType::IntegerConstantType
                (&local_70.
                  super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Kernel::RationalConstantType>
                  .inner._den,
                 &(this->term).oslp.
                  super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Kernel::RationalConstantType>
                  .inner._den);
      bVar3 = sugar::operator<(&local_70,0);
    }
    else {
      local_48.
      super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Kernel::RationalConstantType>
      .config = pCVar2;
      Kernel::IntegerConstantType::IntegerConstantType
                (&local_48.
                  super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Kernel::RationalConstantType>
                  .inner._num,&o->_num);
      Kernel::IntegerConstantType::IntegerConstantType
                (&local_48.
                  super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Kernel::RationalConstantType>
                  .inner._den,
                 &(this->term).oslp.
                  super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Kernel::RationalConstantType>
                  .inner._den);
      bVar3 = sugar::operator>(&local_48,0);
    }
    if ((i.positive & 1U) == 0) {
      mpz_clear(local_70.
                super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Kernel::RationalConstantType>
                .inner._den._val);
      mpz_clear((__mpz_struct *)
                &local_70.
                 super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Kernel::RationalConstantType>
                 .inner);
    }
    else {
      mpz_clear(local_48.
                super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Kernel::RationalConstantType>
                .inner._den._val);
      mpz_clear((__mpz_struct *)
                &local_48.
                 super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Kernel::RationalConstantType>
                 .inner);
    }
  }
  else if (PVar1 == Neq) {
    bVar3 = true;
  }
  else {
    if (PVar1 != Eq) {
      do {
      } while( true );
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool lim(Infty i) const
    { 
      VIRAS_ASSERT(term.oslp != 0);
      switch (symbol) {
      case PredSymbol::Gt:
      case PredSymbol::Geq: return i.positive ? term.oslp > 0 
                                              : term.oslp < 0;
      case PredSymbol::Neq: return true;
      case PredSymbol::Eq: return false;
      }
      VIRAS_UNREACHABLE
    }